

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LICMPass::HoistInstruction(LICMPass *this,Loop *loop,Instruction *inst)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  BasicBlock *pBVar4;
  Instruction *pIVar5;
  mapped_type *ppBVar6;
  Instruction *local_20;
  
  pBVar4 = Loop::GetOrCreatePreHeaderBlock(loop);
  if (pBVar4 != (BasicBlock *)0x0) {
    pIVar5 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar5 == (Instruction *)0x0) ||
       ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pIVar5 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    pIVar1 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    if (((pIVar1 != (Instruction *)0x0) &&
        ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) &&
       ((pIVar1->opcode_ & ~OpUndef) == OpLoopMerge)) {
      pIVar5 = pIVar1;
    }
    if ((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xae,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
        (Instruction *)0x0) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xaf,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar1 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar1 != (Instruction *)0x0) {
      pIVar2 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar2;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar5;
    (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = inst;
    (((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = inst;
    pIVar3 = (this->super_Pass).context_;
    if ((pIVar3->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      local_20 = inst;
      ppBVar6 = std::__detail::
                _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pIVar3->instr_to_block_,&local_20);
      *ppBVar6 = pBVar4;
    }
  }
  return pBVar4 != (BasicBlock *)0x0;
}

Assistant:

bool LICMPass::HoistInstruction(Loop* loop, Instruction* inst) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header_bb = loop->GetOrCreatePreHeaderBlock();
  if (!pre_header_bb) {
    return false;
  }
  Instruction* insertion_point = &*pre_header_bb->tail();
  Instruction* previous_node = insertion_point->PreviousNode();
  if (previous_node && (previous_node->opcode() == spv::Op::OpLoopMerge ||
                        previous_node->opcode() == spv::Op::OpSelectionMerge)) {
    insertion_point = previous_node;
  }

  inst->InsertBefore(insertion_point);
  context()->set_instr_block(inst, pre_header_bb);
  return true;
}